

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall cmGeneratorTarget::AddSourceCommon(cmGeneratorTarget *this,string *src)

{
  undefined1 auVar1 [8];
  cmCompiledGeneratorExpression *x;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  auto_ptr<cmCompiledGeneratorExpression> local_68;
  undefined1 local_60 [8];
  cmGeneratorExpression ge;
  cmListFileBacktrace lfbt;
  
  cmMakefile::GetBacktrace(&lfbt,this->Makefile);
  cmGeneratorExpression::cmGeneratorExpression(&ge,&lfbt);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_60,(string *)&ge);
  auVar1 = local_60;
  local_60 = (undefined1  [8])0x0;
  cge.x_ = (cmCompiledGeneratorExpression *)auVar1;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)local_60);
  *(bool *)((long)auVar1 + 0x178) = true;
  local_60 = (undefined1  [8])operator_new(0x10);
  cge.x_ = (cmCompiledGeneratorExpression *)0x0;
  local_68.x_ = (cmCompiledGeneratorExpression *)0x0;
  *(undefined1 (*) [8])&(((cmState *)local_60)->PropertyDefinitions)._M_t._M_impl = auVar1;
  *(cmLinkImplItem **)
   &(((cmState *)local_60)->PropertyDefinitions)._M_t._M_impl.super__Rb_tree_header._M_header =
       &TargetPropertyEntry::NoLinkImplItem;
  std::
  vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
  ::emplace_back<cmGeneratorTarget::TargetPropertyEntry*>
            ((vector<cmGeneratorTarget::TargetPropertyEntry*,std::allocator<cmGeneratorTarget::TargetPropertyEntry*>>
              *)&this->SourceEntries,(TargetPropertyEntry **)local_60);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGeneratorTarget::KindedSources>_>_>
  ::clear(&(this->KindedSourcesMap)._M_t);
  this->LinkImplementationLanguageIsContextDependent = true;
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&cge);
  cmGeneratorExpression::~cmGeneratorExpression(&ge);
  cmListFileBacktrace::~cmListFileBacktrace(&lfbt);
  return;
}

Assistant:

void cmGeneratorTarget::AddSourceCommon(const std::string& src)
{
  cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
  cmGeneratorExpression ge(lfbt);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(src);
  cge->SetEvaluateForBuildsystem(true);
  this->SourceEntries.push_back(new TargetPropertyEntry(cge));
  this->KindedSourcesMap.clear();
  this->LinkImplementationLanguageIsContextDependent = true;
}